

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto_palette.cpp
# Opt level: O2

ComparisonResult __thiscall ProtoPalette::compare(ProtoPalette *this,ProtoPalette *other)

{
  ushort uVar1;
  ushort uVar2;
  uint __line;
  bool bVar3;
  ComparisonResult CVar4;
  long lVar5;
  byte bVar6;
  long lVar7;
  char *__assertion;
  
  bVar3 = std::is_sorted<unsigned_short_const*>((unsigned_short *)this,(unsigned_short *)(this + 1))
  ;
  if (bVar3) {
    bVar3 = std::is_sorted<unsigned_short_const*>
                      ((unsigned_short *)other,(unsigned_short *)(other + 1));
    if (bVar3) {
      bVar6 = 1;
      bVar3 = false;
      lVar5 = 0;
      lVar7 = 0;
      while ((lVar5 != 8 && (lVar7 != 8))) {
        uVar1 = *(ushort *)((long)(other->_colorIndices)._M_elems + lVar7);
        uVar2 = *(ushort *)((long)(this->_colorIndices)._M_elems + lVar5);
        if (uVar2 == uVar1) {
          lVar5 = lVar5 + 2;
          lVar7 = lVar7 + 2;
        }
        else if (uVar2 < uVar1) {
          lVar5 = lVar5 + 2;
          bVar3 = true;
        }
        else {
          lVar7 = lVar7 + 2;
          bVar6 = 0;
        }
      }
      bVar6 = bVar6 & lVar7 == 8;
      CVar4 = THEY_BIGGER;
      if (bVar3) {
        CVar4 = (uint)bVar6;
      }
      if (lVar5 != 8) {
        CVar4 = (ComparisonResult)bVar6;
      }
      return CVar4;
    }
    __assertion = "std::is_sorted(other._colorIndices.begin(), other._colorIndices.end())";
    __line = 0x2e;
  }
  else {
    __assertion = "std::is_sorted(_colorIndices.begin(), _colorIndices.end())";
    __line = 0x2d;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/gfx/proto_palette.cpp"
                ,__line,
                "ProtoPalette::ComparisonResult ProtoPalette::compare(const ProtoPalette &) const");
}

Assistant:

ProtoPalette::ComparisonResult ProtoPalette::compare(ProtoPalette const &other) const {
	// This works because the sets are sorted numerically
	assert(std::is_sorted(_colorIndices.begin(), _colorIndices.end()));
	assert(std::is_sorted(other._colorIndices.begin(), other._colorIndices.end()));

	auto ours = _colorIndices.begin(), theirs = other._colorIndices.begin();
	bool weBigger = true, theyBigger = true;

	while (ours != _colorIndices.end() && theirs != other._colorIndices.end()) {
		if (*ours == *theirs) {
			++ours;
			++theirs;
		} else if (*ours < *theirs) {
			++ours;
			theyBigger = false;
		} else { // *ours > *theirs
			++theirs;
			weBigger = false;
		}
	}
	weBigger &= theirs == other._colorIndices.end();
	theyBigger &= ours == _colorIndices.end();

	return theyBigger ? THEY_BIGGER : (weBigger ? WE_BIGGER : NEITHER);
}